

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

int32 __thiscall Func::StackAllocate(Func *this,StackSym *stackSym,int size)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  uint uVar5;
  uint uVar6;
  
  if (size < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x2ce,"(size > 0)","size > 0");
    if (!bVar2) goto LAB_004272c9;
    *puVar4 = 0;
  }
  uVar5 = *(uint *)&stackSym->field_0x18;
  uVar6 = uVar5 & 0x100000;
  if ((uVar6 != 0) && (*(short *)&(stackSym->super_Sym).field_0x16 == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
    if (!bVar2) goto LAB_004272c9;
    *puVar4 = 0;
    uVar5 = *(uint *)&stackSym->field_0x18;
    uVar6 = uVar5 & 0x100000;
  }
  iVar3 = stackSym->m_offset;
  if ((uVar5 & 0x401000) == 0 && uVar6 == 0) {
    if (iVar3 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x2d3,"(stackSym->m_offset == 0)","stackSym->m_offset == 0");
      if (!bVar2) {
LAB_004272c9:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      uVar5 = *(uint *)&stackSym->field_0x18;
    }
    *(uint *)&stackSym->field_0x18 = uVar5 | 0x1000;
    iVar3 = StackAllocate(this,size);
    stackSym->m_offset = iVar3;
  }
  return iVar3;
}

Assistant:

int32
Func::StackAllocate(StackSym *stackSym, int size)
{
    Assert(size > 0);
    if (stackSym->IsArgSlotSym() || stackSym->IsParamSlotSym() || stackSym->IsAllocated())
    {
        return stackSym->m_offset;
    }
    Assert(stackSym->m_offset == 0);
    stackSym->m_allocated = true;
    stackSym->m_offset = StackAllocate(size);

    return stackSym->m_offset;
}